

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Performance::textureLookupFragmentTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,int numLookups,
          ConditionalUsage conditionalUsage,ConditionalType conditionalType)

{
  char *local_2a8;
  char *local_2a0;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  allocator<char> local_1a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  int local_120;
  allocator<char> local_119;
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char *local_98;
  char *conditionalTerm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_30 [2];
  int i;
  undefined1 local_1d;
  ConditionalUsage local_1c;
  int local_18;
  ConditionalType conditionalType_local;
  ConditionalUsage conditionalUsage_local;
  int numLookups_local;
  string *resultTemplate;
  
  conditionalType_local = (ConditionalType)this;
  local_1d = 0;
  local_1c = conditionalUsage;
  local_18 = numLookups;
  _conditionalUsage_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             "#version 300 es\nlayout(location = 0) out mediump vec4 o_color;\nin mediump vec2 v_coords${NAME_SPEC};\n"
            );
  if ((local_18 != 0) && (local_1c == CONDITIONAL_USAGE_EVERY_OTHER)) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"in mediump float v_condition${NAME_SPEC};\n");
  }
  for (local_30[0] = 0; local_30[0] < (int)conditionalType_local; local_30[0] = local_30[0] + 1) {
    de::toString<int>((string *)&conditionalTerm,local_30);
    std::operator+(&local_70,"uniform sampler2D u_sampler",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &conditionalTerm);
    std::operator+(&local_50,&local_70,"${NAME_SPEC};\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&conditionalTerm);
  }
  if ((local_18 != 0) && (local_1c == CONDITIONAL_USAGE_FIRST_HALF)) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"uniform mediump float u_condition${NAME_SPEC};\n");
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             "\nvoid main()\n{\n\tmediump vec4 color = vec4(0.0);\n");
  if (local_1c == CONDITIONAL_USAGE_NONE) {
    local_2a0 = "1.0 > 0.0";
  }
  else {
    if (local_1c == CONDITIONAL_USAGE_FIRST_HALF) {
      local_2a8 = "u_condition${NAME_SPEC} > 0.0";
    }
    else {
      local_2a8 = (char *)0x0;
      if (local_1c == CONDITIONAL_USAGE_EVERY_OTHER) {
        local_2a8 = "v_condition${NAME_SPEC} > 0.0";
      }
    }
    local_2a0 = local_2a8;
  }
  local_98 = local_2a0;
  if (local_18 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&i_1,"",&local_119);
    std::operator+(&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                   "\tif (");
    std::operator+(&local_d8,&local_f8,local_98);
    std::operator+(&local_b8,&local_d8,")\n\t{\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&i_1);
    std::allocator<char>::~allocator(&local_119);
  }
  for (local_120 = 0; local_120 < (int)conditionalType_local; local_120 = local_120 + 1) {
    if (local_18 == 1) {
      if (local_120 < (int)(conditionalType_local + CONDITIONAL_TYPE_UNIFORM) / 2) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\t");
      }
    }
    else if ((local_18 == 2) && (local_120 % 2 == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"",&local_1a1);
      std::operator+(&local_180,&local_1a0,"\tif (");
      std::operator+(&local_160,&local_180,local_98);
      std::operator+(&local_140,&local_160,")\n\t");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
    }
    de::toString<int>(&local_208,&local_120);
    std::operator+(&local_1e8,"\tcolor += texture(u_sampler",&local_208);
    std::operator+(&local_1c8,&local_1e8,"${NAME_SPEC}, v_coords${NAME_SPEC});\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    if ((local_18 == 1) &&
       (local_120 == (int)(conditionalType_local - CONDITIONAL_TYPE_UNIFORM) / 2)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\t}\n");
    }
  }
  de::toString<int>(&local_288,(int *)&conditionalType_local);
  std::operator+(&local_268,"\to_color = color/",&local_288);
  std::operator+(&local_248,&local_268,".0 + ${FLOAT01};\n");
  std::operator+(&local_228,&local_248,"${SEMANTIC_ERROR}}\n${INVALID_CHAR}");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  return __return_storage_ptr__;
}

Assistant:

static string textureLookupFragmentTemplate (int numLookups, ConditionalUsage conditionalUsage, ConditionalType conditionalType)
{
	string resultTemplate;

	resultTemplate +=
		"#version 300 es\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"in mediump vec2 v_coords${NAME_SPEC};\n";

	if (conditionalUsage != CONDITIONAL_USAGE_NONE && conditionalType == CONDITIONAL_TYPE_DYNAMIC)
		resultTemplate +=
			"in mediump float v_condition${NAME_SPEC};\n";

	for (int i = 0; i < numLookups; i++)
		resultTemplate +=
			"uniform sampler2D u_sampler" + de::toString(i) + "${NAME_SPEC};\n";

	if (conditionalUsage != CONDITIONAL_USAGE_NONE && conditionalType == CONDITIONAL_TYPE_UNIFORM)
		resultTemplate +=
			"uniform mediump float u_condition${NAME_SPEC};\n";

	resultTemplate +=
		"\n"
		"void main()\n"
		"{\n"
		"	mediump vec4 color = vec4(0.0);\n";

	const char* conditionalTerm = conditionalType == CONDITIONAL_TYPE_STATIC	? "1.0 > 0.0"
								: conditionalType == CONDITIONAL_TYPE_UNIFORM	? "u_condition${NAME_SPEC} > 0.0"
								: conditionalType == CONDITIONAL_TYPE_DYNAMIC	? "v_condition${NAME_SPEC} > 0.0"
								: DE_NULL;

	DE_ASSERT(conditionalTerm != DE_NULL);

	if (conditionalUsage == CONDITIONAL_USAGE_FIRST_HALF)
		resultTemplate += string("") +
			"	if (" + conditionalTerm + ")\n"
			"	{\n";

	for (int i = 0; i < numLookups; i++)
	{
		if (conditionalUsage == CONDITIONAL_USAGE_FIRST_HALF)
		{
			if (i < (numLookups + 1) / 2)
				resultTemplate += "\t";
		}
		else if (conditionalUsage == CONDITIONAL_USAGE_EVERY_OTHER)
		{
			if (i % 2 == 0)
				resultTemplate += string("") +
					"	if (" + conditionalTerm + ")\n"
					"\t";
		}

		resultTemplate +=
			"	color += texture(u_sampler" + de::toString(i) + "${NAME_SPEC}, v_coords${NAME_SPEC});\n";

		if (conditionalUsage == CONDITIONAL_USAGE_FIRST_HALF && i == (numLookups - 1) / 2)
			resultTemplate += "\t}\n";
	}

	resultTemplate +=
		"	o_color = color/" + de::toString(numLookups) + ".0 + ${FLOAT01};\n" +
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}